

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

UnblindParameter * __thiscall
cfd::core::ConfidentialTransaction::UnblindTxOut
          (UnblindParameter *__return_storage_ptr__,ConfidentialTransaction *this,
          uint32_t tx_out_index,Privkey *blinding_key)

{
  uint32_t index;
  bool bVar1;
  reference pvVar2;
  size_t sVar3;
  undefined8 uVar4;
  bool bVar5;
  Script *in_stack_fffffffffffffc30;
  string *in_stack_fffffffffffffc40;
  UnblindParameter *asset;
  undefined8 in_stack_fffffffffffffc48;
  CfdError error_code;
  ConfidentialValue *value;
  CfdException *in_stack_fffffffffffffc50;
  Privkey *blinding_key_00;
  ByteData local_358;
  ByteData local_340;
  ConfidentialNonce local_328;
  ConfidentialAssetId local_300;
  Script local_2d8;
  ConfidentialValue local_2a0;
  ByteData local_278;
  ConfidentialNonce local_260;
  undefined1 local_233;
  undefined1 local_232;
  allocator local_231;
  string local_230 [32];
  CfdSourceLocation local_210;
  byte local_1f1;
  ByteData local_1f0;
  byte local_1d1;
  ByteData local_1d0;
  byte local_1b1;
  ConfidentialValue local_1b0;
  byte local_181;
  ConfidentialNonce local_180;
  ConfidentialAssetId local_148;
  undefined1 local_120 [8];
  ConfidentialTxOut tx_out;
  Privkey *blinding_key_local;
  ConfidentialTransaction *pCStack_18;
  uint32_t tx_out_index_local;
  ConfidentialTransaction *this_local;
  UnblindParameter *result;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffc48 >> 0x20);
  tx_out.range_proof_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)blinding_key;
  blinding_key_local._4_4_ = tx_out_index;
  pCStack_18 = this;
  this_local = (ConfidentialTransaction *)__return_storage_ptr__;
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[0xc])
            (this,(ulong)tx_out_index,0xb6b,"UnblindTxOut");
  pvVar2 = ::std::
           vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::
           operator[](&this->vout_,(ulong)blinding_key_local._4_4_);
  ConfidentialTxOut::ConfidentialTxOut((ConfidentialTxOut *)local_120,pvVar2);
  local_181 = 0;
  local_1b1 = 0;
  local_1d1 = 0;
  local_1f1 = 0;
  ConfidentialTxOut::GetAsset(&local_148,(ConfidentialTxOut *)local_120);
  bVar1 = ConfidentialAssetId::HasBlinding(&local_148);
  bVar5 = true;
  if (bVar1) {
    ConfidentialTxOut::GetNonce(&local_180,(ConfidentialTxOut *)local_120);
    local_181 = 1;
    bVar1 = ConfidentialNonce::HasBlinding(&local_180);
    bVar5 = true;
    if (bVar1) {
      ConfidentialTxOut::GetConfidentialValue(&local_1b0,(ConfidentialTxOut *)local_120);
      local_1b1 = 1;
      bVar1 = ConfidentialValue::HasBlinding(&local_1b0);
      bVar5 = true;
      if (bVar1) {
        ConfidentialTxOut::GetRangeProof(&local_1d0,(ConfidentialTxOut *)local_120);
        local_1d1 = 1;
        sVar3 = ByteData::GetDataSize(&local_1d0);
        bVar5 = true;
        if (sVar3 != 0) {
          ConfidentialTxOut::GetSurjectionProof(&local_1f0,(ConfidentialTxOut *)local_120);
          local_1f1 = 1;
          sVar3 = ByteData::GetDataSize(&local_1f0);
          bVar5 = sVar3 == 0;
        }
      }
    }
  }
  if ((local_1f1 & 1) != 0) {
    ByteData::~ByteData((ByteData *)0x4e4680);
  }
  if ((local_1d1 & 1) != 0) {
    ByteData::~ByteData((ByteData *)0x4e4697);
  }
  if ((local_1b1 & 1) != 0) {
    ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x4e46ae);
  }
  if ((local_181 & 1) != 0) {
    ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)0x4e46c5);
  }
  ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x4e46d1);
  if (!bVar5) {
    local_233 = 0;
    ConfidentialTxOut::GetNonce(&local_260,(ConfidentialTxOut *)local_120);
    blinding_key_00 =
         (Privkey *)
         tx_out.range_proof_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    ConfidentialTxOut::GetRangeProof(&local_278,(ConfidentialTxOut *)local_120);
    ConfidentialTxOut::GetConfidentialValue(&local_2a0,(ConfidentialTxOut *)local_120);
    AbstractTxOut::GetLockingScript(&local_2d8,(AbstractTxOut *)local_120);
    ConfidentialTxOut::GetAsset(&local_300,(ConfidentialTxOut *)local_120);
    CalculateUnblindData
              (__return_storage_ptr__,&local_260,blinding_key_00,&local_278,&local_2a0,&local_2d8,
               &local_300);
    ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x4e49c6);
    Script::~Script(in_stack_fffffffffffffc30);
    ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x4e49de);
    ByteData::~ByteData((ByteData *)0x4e49ea);
    ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)0x4e49f6);
    index = blinding_key_local._4_4_;
    value = &__return_storage_ptr__->value;
    asset = __return_storage_ptr__;
    ConfidentialNonce::ConfidentialNonce(&local_328);
    ByteData::ByteData(&local_340);
    ByteData::ByteData(&local_358);
    SetTxOutCommitment(this,index,&asset->asset,value,&local_328,&local_340,&local_358);
    ByteData::~ByteData((ByteData *)0x4e4a8e);
    ByteData::~ByteData((ByteData *)0x4e4a9a);
    ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)0x4e4aa6);
    local_233 = 1;
    ConfidentialTxOut::~ConfidentialTxOut((ConfidentialTxOut *)local_120);
    return __return_storage_ptr__;
  }
  local_210.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_elements_transaction.cpp"
               ,0x2f);
  local_210.filename = local_210.filename + 1;
  local_210.line = 0xb73;
  local_210.funcname = "UnblindTxOut";
  logger::warn<unsigned_int&>
            (&local_210,
             "Failed to unblind TxOut. Target TxOut already unblinded.: tx_out_index=[{}]",
             (uint *)((long)&blinding_key_local + 4));
  local_232 = 1;
  uVar4 = __cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            (local_230,"Failed to unblind TxOut. Target TxOut already unblinded.",&local_231);
  CfdException::CfdException(in_stack_fffffffffffffc50,error_code,in_stack_fffffffffffffc40);
  local_232 = 0;
  __cxa_throw(uVar4,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

UnblindParameter ConfidentialTransaction::UnblindTxOut(
    uint32_t tx_out_index, const Privkey &blinding_key) {
  CheckTxOutIndex(tx_out_index, __LINE__, __FUNCTION__);

  ConfidentialTxOut tx_out(vout_[tx_out_index]);
  if (!tx_out.GetAsset().HasBlinding() || !tx_out.GetNonce().HasBlinding() ||
      !tx_out.GetConfidentialValue().HasBlinding() ||
      (tx_out.GetRangeProof().GetDataSize() == 0) ||
      (tx_out.GetSurjectionProof().GetDataSize() == 0)) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to unblind TxOut. Target TxOut already unblinded.: "
        "tx_out_index=[{}]",
        tx_out_index);
    throw CfdException(
        kCfdIllegalStateError,
        "Failed to unblind TxOut. Target TxOut already unblinded.");
  }

  UnblindParameter result = CalculateUnblindData(
      tx_out.GetNonce(), blinding_key, tx_out.GetRangeProof(),
      tx_out.GetConfidentialValue(), tx_out.GetLockingScript(),
      tx_out.GetAsset());

  // clear and set unblind value to txout
  SetTxOutCommitment(
      tx_out_index, result.asset, result.value, ConfidentialNonce(),
      ByteData(), ByteData());

  return result;
}